

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::~Parser(Parser *this)

{
  Parser *in_RDI;
  
  _free(in_RDI);
  _clr(in_RDI);
  detail::stack<c4::yml::Parser::State,_16UL>::~stack
            ((stack<c4::yml::Parser::State,_16UL> *)0x397464);
  return;
}

Assistant:

Parser::~Parser()
{
    _free();
    _clr();
}